

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::
AddNestedExtensions<google::protobuf::DescriptorProto>
          (DescriptorIndex *this,StringPiece filename,DescriptorProto *message_type)

{
  Rep *pRVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  void **ppvVar5;
  bool bVar6;
  
  pRVar1 = (message_type->nested_type_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  lVar4 = (long)(message_type->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  bVar6 = lVar4 == 0;
  if (!bVar6) {
    bVar2 = AddNestedExtensions<google::protobuf::DescriptorProto>
                      (this,filename,(DescriptorProto *)*ppvVar5);
    if (bVar2) {
      lVar3 = 8;
      do {
        bVar6 = lVar4 * 8 == lVar3;
        if (bVar6) goto LAB_0038ec30;
        bVar2 = AddNestedExtensions<google::protobuf::DescriptorProto>
                          (this,filename,*(DescriptorProto **)((long)ppvVar5 + lVar3));
        lVar3 = lVar3 + 8;
      } while (bVar2);
    }
    if (!bVar6) {
      return false;
    }
  }
LAB_0038ec30:
  pRVar1 = (message_type->extension_).super_RepeatedPtrFieldBase.rep_;
  ppvVar5 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar5 = (void **)0x0;
  }
  lVar4 = (long)(message_type->extension_).super_RepeatedPtrFieldBase.current_size_;
  bVar6 = lVar4 == 0;
  if ((!bVar6) &&
     (bVar2 = AddExtension<google::protobuf::FieldDescriptorProto>
                        (this,filename,(FieldDescriptorProto *)*ppvVar5), bVar2)) {
    lVar3 = 8;
    do {
      bVar6 = lVar4 * 8 == lVar3;
      if (bVar6) {
        return bVar6;
      }
      bVar2 = AddExtension<google::protobuf::FieldDescriptorProto>
                        (this,filename,*(FieldDescriptorProto **)((long)ppvVar5 + lVar3));
      lVar3 = lVar3 + 8;
    } while (bVar2);
  }
  return bVar6;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddNestedExtensions(
    StringPiece filename, const DescProto& message_type) {
  for (const auto& nested_type : message_type.nested_type()) {
    if (!AddNestedExtensions(filename, nested_type)) return false;
  }
  for (const auto& extension : message_type.extension()) {
    if (!AddExtension(filename, extension)) return false;
  }
  return true;
}